

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool Curl_ssl_getsessionid(connectdata *conn,void **ssl_sessionid,size_t *idsize,int sockindex)

{
  byte bVar1;
  Curl_easy *pCVar2;
  Curl_share *pCVar3;
  curl_ssl_session *pcVar4;
  char *second;
  long lVar5;
  proxy_info *ppVar6;
  _Bool _Var7;
  int iVar8;
  uint uVar9;
  long *plVar10;
  ssl_primary_config *data;
  long lVar11;
  char *first;
  ulong uVar12;
  int local_54;
  
  pCVar2 = conn->data;
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    if ((conn->bits).proxy_ssl_connected[sockindex] == true) {
      data = &conn->ssl_config;
      ppVar6 = (proxy_info *)&conn->host;
      local_54 = conn->remote_port;
    }
    else {
      data = &conn->proxy_ssl_config;
      ppVar6 = &conn->http_proxy;
      local_54 = (int)conn->port;
    }
    first = (ppVar6->host).name;
    *ssl_sessionid = (void *)0x0;
    if (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete) {
      bVar1 = (pCVar2->set).proxy_ssl.primary.field_0x48;
      goto joined_r0x00148c79;
    }
  }
  else {
    data = &conn->ssl_config;
    first = (conn->host).name;
    local_54 = conn->remote_port;
    *ssl_sessionid = (void *)0x0;
  }
  bVar1 = (pCVar2->set).ssl.primary.field_0x48;
joined_r0x00148c79:
  if ((bVar1 & 8) != 0) {
    pCVar3 = pCVar2->share;
    if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 0x10) == 0)) {
      plVar10 = &(pCVar2->state).sessionage;
    }
    else {
      plVar10 = &pCVar3->sessionage;
    }
    lVar11 = 0x38;
    for (uVar12 = 0; uVar12 < (pCVar2->set).general_ssl.max_ssl_sessions; uVar12 = uVar12 + 1) {
      pcVar4 = (pCVar2->state).session;
      if ((*(long *)((long)pcVar4 + lVar11 + -0x20) != 0) &&
         (iVar8 = Curl_strcasecompare(first,*(char **)((long)pcVar4 + lVar11 + -0x38)), iVar8 != 0))
      {
        uVar9 = *(uint *)&(conn->bits).field_0x4;
        second = *(char **)((long)pcVar4 + lVar11 + -0x30);
        if ((uVar9 & 4) == 0) {
          if (second == (char *)0x0) {
LAB_00148d31:
            iVar8 = *(int *)((long)pcVar4 + lVar11 + -4);
            if ((uVar9 & 8) == 0) {
              if (iVar8 == -1) {
LAB_00148d4f:
                if (((local_54 == *(int *)((long)pcVar4 + lVar11 + -8)) &&
                    (iVar8 = Curl_strcasecompare(conn->handler->scheme,
                                                 *(char **)((long)pcVar4 + lVar11 + -0x28)),
                    iVar8 != 0)) &&
                   (_Var7 = Curl_ssl_config_matches
                                      (data,(ssl_primary_config *)((long)&pcVar4->name + lVar11)),
                   _Var7)) {
                  lVar5 = *plVar10;
                  *plVar10 = lVar5 + 1;
                  *(long *)((long)pcVar4 + lVar11 + -0x10) = lVar5 + 1;
                  *ssl_sessionid = *(void **)((long)pcVar4 + lVar11 + -0x20);
                  if (idsize != (size_t *)0x0) {
                    *idsize = *(size_t *)((long)pcVar4 + lVar11 + -0x18);
                  }
                  return false;
                }
              }
            }
            else if ((iVar8 != -1) && (conn->conn_to_port == iVar8)) goto LAB_00148d4f;
          }
        }
        else if ((second != (char *)0x0) &&
                (iVar8 = Curl_strcasecompare((conn->conn_to_host).name,second), iVar8 != 0)) {
          uVar9 = *(uint *)&(conn->bits).field_0x4;
          goto LAB_00148d31;
        }
      }
      lVar11 = lVar11 + 0x88;
    }
  }
  return true;
}

Assistant:

bool Curl_ssl_getsessionid(struct connectdata *conn,
                           void **ssl_sessionid,
                           size_t *idsize, /* set 0 if unknown */
                           int sockindex)
{
  struct curl_ssl_session *check;
  struct Curl_easy *data = conn->data;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

  const bool isProxy = CONNECT_PROXY_SSL();
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;
  const char * const name = isProxy ? conn->http_proxy.host.name :
    conn->host.name;
  int port = isProxy ? (int)conn->port : conn->remote_port;
  *ssl_sessionid = NULL;

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  if(!SSL_SET_OPTION(primary.sessionid))
    /* session ID re-use is disabled */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(name, check->name) &&
       ((!conn->bits.conn_to_host && !check->conn_to_host) ||
        (conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(conn->conn_to_host.name, check->conn_to_host))) &&
       ((!conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (conn->bits.conn_to_port && check->conn_to_port != -1 &&
         conn->conn_to_port == check->conn_to_port)) &&
       (port == check->remote_port) &&
       strcasecompare(conn->handler->scheme, check->scheme) &&
       Curl_ssl_config_matches(ssl_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  return no_match;
}